

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict,xmlChar *prefix,xmlChar *name,int maybeLen,int update)

{
  ulong uVar1;
  xmlDict *dict_00;
  xmlChar *pxVar2;
  undefined4 uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  xmlDictEntry *__src;
  xmlDictEntry *pxVar7;
  xmlChar *pxVar8;
  uint uVar9;
  ulong uVar10;
  xmlDictEntry *pxVar11;
  uint uVar12;
  xmlDictEntry *pxVar13;
  int found;
  size_t len;
  size_t plen;
  int local_5c;
  uint local_58;
  undefined4 uStack_54;
  uint local_50;
  undefined4 uStack_4c;
  uint local_48;
  uint local_44;
  ulong local_40;
  xmlDictEntry *local_38;
  
  local_5c = 0;
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    if (prefix == (xmlChar *)0x0) {
      iVar5 = -1;
      if (-1 < maybeLen) {
        iVar5 = maybeLen;
      }
      uVar4 = xmlDictHashName(dict->seed,name,(long)iVar5,(size_t *)&local_58);
      local_40 = CONCAT44(uStack_54,local_58);
      uVar10 = local_40;
      if (0x3fffffff < local_40) {
        return (xmlDictEntry *)0x0;
      }
    }
    else {
      uVar4 = xmlDictHashQName(dict->seed,prefix,name,(size_t *)&local_50,(size_t *)&local_58);
      uVar10 = CONCAT44(uStack_54,local_58);
      if (0x3fffffff < uVar10) {
        return (xmlDictEntry *)0x0;
      }
      if (0x3fffffff - uVar10 <= CONCAT44(uStack_4c,local_50)) {
        return (xmlDictEntry *)0x0;
      }
      local_40 = CONCAT44(uStack_4c,local_50) + uVar10 + 1;
    }
    if (local_40 <= dict->limit - 1) {
      if (dict->size == 0) {
        uVar9 = 8;
        __src = (xmlDictEntry *)0x0;
      }
      else {
        __src = xmlDictFindEntry(dict,prefix,name,(int)local_40,uVar4,&local_5c);
        if (local_5c != 0) {
          return __src;
        }
        uVar1 = dict->size;
        uVar9 = 0;
        if ((uVar1 & 0xfffffffffffffff8) - (uVar1 >> 3) < (ulong)(dict->nbElems + 1)) {
          if (0x7fffffff < uVar1) {
            return (xmlDictEntry *)0x0;
          }
          uVar9 = (int)uVar1 * 2;
        }
      }
      dict_00 = dict->subdict;
      if ((dict_00 != (xmlDict *)0x0) && (dict_00->size != 0)) {
        local_48 = uVar4;
        local_44 = uVar9;
        local_38 = __src;
        if (prefix == (xmlChar *)0x0) {
          uVar4 = xmlDictHashName(dict_00->seed,name,uVar10,(size_t *)&local_58);
          pxVar8 = (xmlChar *)0x0;
        }
        else {
          uVar4 = xmlDictHashQName(dict_00->seed,prefix,name,(size_t *)&local_50,(size_t *)&local_58
                                  );
          pxVar8 = prefix;
        }
        pxVar7 = xmlDictFindEntry(dict_00,pxVar8,name,(int)local_40,uVar4,&local_5c);
        __src = local_38;
        uVar4 = local_48;
        uVar9 = local_44;
        if (local_5c != 0) {
          return pxVar7;
        }
      }
      if (update != 0) {
        if (uVar9 != 0) {
          iVar5 = xmlDictGrow(dict,uVar9);
          if (iVar5 != 0) {
            return (xmlDictEntry *)0x0;
          }
          uVar6 = (int)dict->size - 1;
          uVar10 = (ulong)(uVar6 & uVar4);
          pxVar7 = dict->table;
          __src = pxVar7 + uVar10;
          uVar9 = pxVar7[uVar10].hashValue;
          if (uVar9 != 0) {
            uVar12 = 0;
            do {
              if (((int)uVar10 - uVar9 & uVar6) < uVar12) break;
              uVar12 = uVar12 + 1;
              uVar9 = (int)uVar10 + 1;
              uVar10 = (ulong)uVar9;
              __src = __src + 1;
              if ((uVar9 & uVar6) == 0) {
                __src = pxVar7;
              }
              uVar9 = __src->hashValue;
            } while (uVar9 != 0);
          }
        }
        if (prefix == (xmlChar *)0x0) {
          pxVar8 = xmlDictAddString(dict,name,local_58);
        }
        else {
          pxVar8 = xmlDictAddQString(dict,prefix,local_50,name,local_58);
        }
        if (pxVar8 != (xmlChar *)0x0) {
          if (__src->hashValue != 0) {
            pxVar7 = dict->table;
            pxVar13 = pxVar7 + dict->size;
            pxVar11 = __src;
            do {
              pxVar11 = pxVar11 + 1;
              if (pxVar13 <= pxVar11) {
                pxVar11 = pxVar7;
              }
            } while (pxVar11->hashValue != 0);
            if (pxVar11 < __src) {
              memmove(pxVar7 + 1,pxVar7,(long)pxVar11 - (long)pxVar7);
              pxVar7 = dict->table;
              uVar3 = *(undefined4 *)&pxVar13[-1].field_0x4;
              pxVar2 = pxVar13[-1].name;
              pxVar11 = pxVar13 + -1;
              pxVar7->hashValue = pxVar13[-1].hashValue;
              *(undefined4 *)&pxVar7->field_0x4 = uVar3;
              pxVar7->name = pxVar2;
            }
            memmove(__src + 1,__src,(long)pxVar11 - (long)__src);
          }
          __src->hashValue = uVar4;
          __src->name = pxVar8;
          dict->nbElems = dict->nbElems + 1;
          return __src;
        }
      }
    }
  }
  return (xmlDictEntry *)0x0;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static const xmlDictEntry *
xmlDictLookupInternal(xmlDictPtr dict, const xmlChar *prefix,
                      const xmlChar *name, int maybeLen, int update) {
    xmlDictEntry *entry = NULL;
    const xmlChar *ret;
    unsigned hashValue, newSize;
    size_t maxLen, len, plen, klen;
    int found = 0;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    maxLen = (maybeLen < 0) ? SIZE_MAX : (size_t) maybeLen;

    if (prefix == NULL) {
        hashValue = xmlDictHashName(dict->seed, name, maxLen, &len);
        if (len > INT_MAX / 2)
            return(NULL);
        klen = len;
    } else {
        hashValue = xmlDictHashQName(dict->seed, prefix, name, &plen, &len);
        if ((len > INT_MAX / 2) || (plen >= INT_MAX / 2 - len))
            return(NULL);
        klen = plen + 1 + len;
    }

    if ((dict->limit > 0) && (klen >= dict->limit))
        return(NULL);

    /*
     * Check for an existing entry
     */
    if (dict->size == 0) {
        newSize = MIN_HASH_SIZE;
    } else {
        entry = xmlDictFindEntry(dict, prefix, name, klen, hashValue, &found);
        if (found)
            return(entry);

        if (dict->nbElems + 1 > dict->size / MAX_FILL_DENOM * MAX_FILL_NUM) {
            if (dict->size >= MAX_HASH_SIZE)
                return(NULL);
            newSize = dict->size * 2;
        } else {
            newSize = 0;
        }
    }

    if ((dict->subdict != NULL) && (dict->subdict->size > 0)) {
        xmlDictEntry *subEntry;
        unsigned subHashValue;

        if (prefix == NULL)
            subHashValue = xmlDictHashName(dict->subdict->seed, name, len,
                                           &len);
        else
            subHashValue = xmlDictHashQName(dict->subdict->seed, prefix, name,
                                            &plen, &len);
        subEntry = xmlDictFindEntry(dict->subdict, prefix, name, klen,
                                    subHashValue, &found);
        if (found)
            return(subEntry);
    }

    if (!update)
        return(NULL);

    /*
     * Grow the hash table if needed
     */
    if (newSize > 0) {
        unsigned mask, displ, pos;

        if (xmlDictGrow(dict, newSize) != 0)
            return(NULL);

        /*
         * Find new entry
         */
        mask = dict->size - 1;
        displ = 0;
        pos = hashValue & mask;
        entry = &dict->table[pos];

        while ((entry->hashValue != 0) &&
               ((pos - entry->hashValue) & mask) >= displ) {
            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = dict->table;
        }
    }

    if (prefix == NULL)
        ret = xmlDictAddString(dict, name, len);
    else
        ret = xmlDictAddQString(dict, prefix, plen, name, len);
    if (ret == NULL)
        return(NULL);

    /*
     * Shift the remainder of the probe sequence to the right
     */
    if (entry->hashValue != 0) {
        const xmlDictEntry *end = &dict->table[dict->size];
        const xmlDictEntry *cur = entry;

        do {
            cur++;
            if (cur >= end)
                cur = dict->table;
        } while (cur->hashValue != 0);

        if (cur < entry) {
            /*
             * If we traversed the end of the buffer, handle the part
             * at the start of the buffer.
             */
            memmove(&dict->table[1], dict->table,
                    (char *) cur - (char *) dict->table);
            cur = end - 1;
            dict->table[0] = *cur;
        }

        memmove(&entry[1], entry, (char *) cur - (char *) entry);
    }

    /*
     * Populate entry
     */
    entry->hashValue = hashValue;
    entry->name = ret;

    dict->nbElems++;

    return(entry);
}